

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.h
# Opt level: O2

Float __thiscall pbrt::TabulatedBSSRDF::PDF_Sp(TabulatedBSSRDF *this,Point3f *pi,Normal3f *ni)

{
  Float r;
  float fVar1;
  undefined1 auVar2 [16];
  int ch;
  int ch_00;
  int axis;
  long lVar3;
  undefined1 auVar4 [16];
  Float FVar5;
  undefined8 in_XMM0_Qb;
  undefined1 auVar7 [56];
  undefined1 auVar6 [64];
  undefined1 auVar8 [16];
  Vector3<float> v;
  Vector3f VVar9;
  Normal3f NVar10;
  Frame f;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined4 local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  Frame local_44;
  
  v = Point3<float>::operator-(pi,&this->po);
  Frame::FromZ(&local_44,(Vector3f)(this->ns).super_Tuple3<pbrt::Normal3,_float>);
  VVar9 = Frame::ToLocal(&local_44,v.super_Tuple3<pbrt::Vector3,_float>);
  auVar7 = ZEXT856(0);
  NVar10 = Frame::ToLocal(&local_44,ni->super_Tuple3<pbrt::Normal3,_float>);
  auVar6._0_8_ = NVar10.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar6._8_56_ = auVar7;
  local_58 = auVar6._0_16_;
  lVar3 = 0;
  fVar1 = VVar9.super_Tuple3<pbrt::Vector3,_float>.z * VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
  local_88 = VVar9.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_84 = VVar9.super_Tuple3<pbrt::Vector3,_float>.y;
  fStack_80 = (float)in_XMM0_Qb;
  fStack_7c = (float)((ulong)in_XMM0_Qb >> 0x20);
  auVar4._0_4_ = local_88 * local_88;
  auVar4._4_4_ = fStack_84 * fStack_84;
  auVar4._8_4_ = fStack_80 * fStack_80;
  auVar4._12_4_ = fStack_7c * fStack_7c;
  auVar8._0_4_ = fVar1 + auVar4._0_4_;
  auVar8._4_4_ = fVar1 + auVar4._4_4_;
  auVar8._8_4_ = fVar1 + auVar4._8_4_;
  auVar8._12_4_ = fVar1 + auVar4._12_4_;
  auVar4 = vhaddps_avx(auVar4,auVar4);
  auVar8 = vsqrtps_avx(auVar8);
  auVar2 = vsqrtss_avx(auVar4,auVar4);
  local_68 = vmovshdup_avx(local_58);
  auVar6 = ZEXT864(0) << 0x20;
  auVar4 = vshufps_avx(auVar8,auVar8,0xe1);
  local_78 = vmovlps_avx(auVar4);
  local_70 = auVar2._0_4_;
  for (; lVar3 != 3; lVar3 = lVar3 + 1) {
    r = *(Float *)((long)&local_78 + lVar3 * 4);
    ch_00 = 0;
    while (ch_00 != 4) {
      FVar5 = PDF_Sr(this,ch_00,r);
      auVar4 = local_58;
      if (((int)lVar3 != 0) && (auVar4 = local_68, (int)lVar3 != 1)) {
        auVar4 = ZEXT416((uint)NVar10.super_Tuple3<pbrt::Normal3,_float>.z);
      }
      auVar2._8_4_ = 0x7fffffff;
      auVar2._0_8_ = 0x7fffffff7fffffff;
      auVar2._12_4_ = 0x7fffffff;
      auVar4 = vandps_avx512vl(auVar4,auVar2);
      ch_00 = ch_00 + 1;
      auVar4 = vfmadd231ss_fma(ZEXT416(auVar6._0_4_),ZEXT416((uint)(FVar5 * auVar4._0_4_ * 0.25)),
                               ZEXT416((uint)(&DAT_0053e00c)[lVar3]));
      auVar6 = ZEXT1664(auVar4);
    }
  }
  return auVar6._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float PDF_Sp(const Point3f &pi, const Normal3f &ni) const {
        // Express $\pti-\pto$ and $\bold{n}_i$ with respect to local coordinates at
        // $\pto$
        Vector3f d = pi - po;
        Frame f = Frame::FromZ(ns);
        Vector3f dLocal = f.ToLocal(d);
        Normal3f nLocal = f.ToLocal(ni);

        // Compute BSSRDF profile radius under projection along each axis
        Float rProj[3] = {std::sqrt(Sqr(dLocal.y) + Sqr(dLocal.z)),
                          std::sqrt(Sqr(dLocal.z) + Sqr(dLocal.x)),
                          std::sqrt(Sqr(dLocal.x) + Sqr(dLocal.y))};

        // Return combined probability from all BSSRDF sampling strategies
        Float pdf = 0, axisProb[3] = {.25f, .25f, .5f};
        Float chProb = 1 / (Float)NSpectrumSamples;
        for (int axis = 0; axis < 3; ++axis)
            for (int ch = 0; ch < NSpectrumSamples; ++ch)
                pdf += PDF_Sr(ch, rProj[axis]) * std::abs(nLocal[axis]) * chProb *
                       axisProb[axis];
        return pdf;
    }